

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uws_client.c
# Opt level: O3

int uws_client_send_frame_async
              (UWS_CLIENT_HANDLE uws_client,uchar frame_type,uchar *buffer,size_t size,
              _Bool is_final,ON_WS_SEND_FRAME_COMPLETE on_ws_send_frame_complete,
              void *on_ws_send_frame_complete_context)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  undefined8 *__ptr;
  BUFFER_HANDLE handle;
  uchar *buffer_00;
  size_t size_00;
  LIST_ITEM_HANDLE item;
  LIST_ITEM_HANDLE pLVar3;
  int iVar4;
  char *pcVar5;
  
  if (uws_client == (UWS_CLIENT_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x7bc;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x7bc;
    }
    pcVar5 = "NULL uws handle.";
    iVar4 = 0x7bb;
LAB_0013bd86:
    (*p_Var2)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/uws_client.c"
              ,"uws_client_send_frame_async",iVar4,1,pcVar5);
    return iVar1;
  }
  if (size != 0 && buffer == (uchar *)0x0) {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x7c3;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x7c3;
    }
    pcVar5 = "NULL buffer with %u size.";
    iVar4 = 0x7c2;
    goto LAB_0013bd86;
  }
  if (uws_client->uws_state != UWS_STATE_OPEN) {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x7cb;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x7cb;
    }
    pcVar5 = "uws not in OPEN state.";
    iVar4 = 0x7ca;
    goto LAB_0013bd86;
  }
  __ptr = (undefined8 *)malloc(0x18);
  if (__ptr == (undefined8 *)0x0) {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x7d4;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x7d4;
    }
    pcVar5 = "Cannot allocate memory for frame to be sent.";
    iVar4 = 0x7d3;
    goto LAB_0013bd86;
  }
  handle = uws_frame_encoder_encode((uint)frame_type,buffer,size,true,is_final,'\0');
  if (handle == (BUFFER_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/uws_client.c"
                ,"uws_client_send_frame_async",0x7e2,1,"Failed encoding WebSocket frame");
    }
    free(__ptr);
    return 0x7e4;
  }
  buffer_00 = BUFFER_u_char(handle);
  size_00 = BUFFER_length(handle);
  *__ptr = on_ws_send_frame_complete;
  __ptr[1] = on_ws_send_frame_complete_context;
  __ptr[2] = uws_client;
  item = singlylinkedlist_add(uws_client->pending_sends,__ptr);
  if (item == (LIST_ITEM_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x800;
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/uws_client.c"
                ,"uws_client_send_frame_async",0x7fe,1,
                "Could not allocate memory for pending frames");
    }
  }
  else {
    iVar1 = xio_send(uws_client->underlying_io,buffer_00,size_00,on_underlying_io_send_complete,item
                    );
    if (iVar1 == 0) {
      iVar1 = 0;
      goto LAB_0013be35;
    }
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/uws_client.c"
                ,"uws_client_send_frame_async",0x80e,1,
                "Could not send bytes through the underlying IO");
    }
    pLVar3 = singlylinkedlist_find(uws_client->pending_sends,find_list_node,item);
    if (pLVar3 == (LIST_ITEM_HANDLE)0x0) {
      iVar1 = 0x818;
      goto LAB_0013be35;
    }
    singlylinkedlist_remove(uws_client->pending_sends,item);
    iVar1 = 0x818;
  }
  free(__ptr);
LAB_0013be35:
  BUFFER_delete(handle);
  return iVar1;
}

Assistant:

int uws_client_send_frame_async(UWS_CLIENT_HANDLE uws_client, unsigned char frame_type, const unsigned char* buffer, size_t size, bool is_final, ON_WS_SEND_FRAME_COMPLETE on_ws_send_frame_complete, void* on_ws_send_frame_complete_context)
{
    int result;

    if (uws_client == NULL)
    {
        /* Codes_SRS_UWS_CLIENT_01_044: [ If any the arguments uws_client is NULL, uws_client_send_frame_async shall fail and return a non-zero value. ]*/
        LogError("NULL uws handle.");
        result = MU_FAILURE;
    }
    else if ((buffer == NULL) &&
        (size > 0))
    {
        /* Codes_SRS_UWS_CLIENT_01_045: [ If size is non-zero and buffer is NULL then uws_client_send_frame_async shall fail and return a non-zero value. ]*/
        LogError("NULL buffer with %u size.", (unsigned int)size);
        result = MU_FAILURE;
    }
    /* Codes_SRS_UWS_CLIENT_01_146: [ A data frame MAY be transmitted by either the client or the server at any time after opening handshake completion and before that endpoint has sent a Close frame (Section 5.5.1). ]*/
    /* Codes_SRS_UWS_CLIENT_01_268: [ The endpoint MUST ensure the WebSocket connection is in the OPEN state ]*/
    else if (uws_client->uws_state != UWS_STATE_OPEN)
    {
        /* Codes_SRS_UWS_CLIENT_01_043: [ If the uws instance is not OPEN (open has not been called or is still in progress) then uws_client_send_frame_async shall fail and return a non-zero value. ]*/
        LogError("uws not in OPEN state.");
        result = MU_FAILURE;
    }
    else
    {
        WS_PENDING_SEND* ws_pending_send = (WS_PENDING_SEND*)malloc(sizeof(WS_PENDING_SEND));
        if (ws_pending_send == NULL)
        {
            /* Codes_SRS_UWS_CLIENT_01_047: [ If allocating memory for the newly queued item fails, uws_client_send_frame_async shall fail and return a non-zero value. ]*/
            LogError("Cannot allocate memory for frame to be sent.");
            result = MU_FAILURE;
        }
        else
        {
            BUFFER_HANDLE non_control_frame_buffer;

            /* Codes_SRS_UWS_CLIENT_01_425: [ Encoding shall be done by calling uws_frame_encoder_encode and passing to it the buffer and size argument for payload, the is_final flag and setting is_masked to true. ]*/
            /* Codes_SRS_UWS_CLIENT_01_270: [ An endpoint MUST encapsulate the /data/ in a WebSocket frame as defined in Section 5.2. ]*/
            /* Codes_SRS_UWS_CLIENT_01_272: [ The opcode (frame-opcode) of the first frame containing the data MUST be set to the appropriate value from Section 5.2 for data that is to be interpreted by the recipient as text or binary data. ]*/
            /* Codes_SRS_UWS_CLIENT_01_274: [ If the data is being sent by the client, the frame(s) MUST be masked as defined in Section 5.3. ]*/
            non_control_frame_buffer = uws_frame_encoder_encode((WS_FRAME_TYPE)frame_type, buffer, size, true, is_final, 0);
            if (non_control_frame_buffer == NULL)
            {
                /* Codes_SRS_UWS_CLIENT_01_426: [ If uws_frame_encoder_encode fails, uws_client_send_frame_async shall fail and return a non-zero value. ]*/
                LogError("Failed encoding WebSocket frame");
                free(ws_pending_send);
                result = MU_FAILURE;
            }
            else
            {
                const unsigned char* encoded_frame;
                size_t encoded_frame_length;
                LIST_ITEM_HANDLE new_pending_send_list_item;

                /* Codes_SRS_UWS_CLIENT_01_428: [ The encoded frame buffer memory shall be obtained by calling BUFFER_u_char on the encode buffer. ]*/
                encoded_frame = BUFFER_u_char(non_control_frame_buffer);
                /* Codes_SRS_UWS_CLIENT_01_429: [ The encoded frame size shall be obtained by calling BUFFER_length on the encode buffer. ]*/
                encoded_frame_length = BUFFER_length(non_control_frame_buffer);

                /* Codes_SRS_UWS_CLIENT_01_038: [ uws_client_send_frame_async shall create and queue a structure that contains: ]*/
                /* Codes_SRS_UWS_CLIENT_01_050: [ The argument on_ws_send_frame_complete shall be optional, if NULL is passed by the caller then no send complete callback shall be triggered. ]*/
                /* Codes_SRS_UWS_CLIENT_01_040: [ - the send complete callback on_ws_send_frame_complete ]*/
                /* Codes_SRS_UWS_CLIENT_01_041: [ - the send complete callback context on_ws_send_frame_complete_context ]*/
                ws_pending_send->on_ws_send_frame_complete = on_ws_send_frame_complete;
                ws_pending_send->context = on_ws_send_frame_complete_context;
                ws_pending_send->uws_client = uws_client;

                /* Codes_SRS_UWS_CLIENT_01_048: [ Queueing shall be done by calling singlylinkedlist_add. ]*/
                new_pending_send_list_item = singlylinkedlist_add(uws_client->pending_sends, ws_pending_send);
                if (new_pending_send_list_item == NULL)
                {
                    /* Codes_SRS_UWS_CLIENT_01_049: [ If singlylinkedlist_add fails, uws_client_send_frame_async shall fail and return a non-zero value. ]*/
                    LogError("Could not allocate memory for pending frames");
                    free(ws_pending_send);
                    result = MU_FAILURE;
                }
                else
                {
                    /* Codes_SRS_UWS_CLIENT_01_431: [ Once encoded the frame shall be sent by using xio_send with the following arguments: ]*/
                    /* Codes_SRS_UWS_CLIENT_01_053: [ - the io handle shall be the underlyiong IO handle created in uws_client_create. ]*/
                    /* Codes_SRS_UWS_CLIENT_01_054: [ - the buffer argument shall point to the complete websocket frame to be sent. ]*/
                    /* Codes_SRS_UWS_CLIENT_01_055: [ - the size argument shall indicate the websocket frame length. ]*/
                    /* Codes_SRS_UWS_CLIENT_01_056: [ - the send_complete callback shall be the on_underlying_io_send_complete function. ]*/
                    /* Codes_SRS_UWS_CLIENT_01_057: [ - the send_complete_context argument shall identify the pending send. ]*/
                    /* Codes_SRS_UWS_CLIENT_01_276: [ The frame(s) that have been formed MUST be transmitted over the underlying network connection. ]*/
                    if (xio_send(uws_client->underlying_io, encoded_frame, encoded_frame_length, on_underlying_io_send_complete, new_pending_send_list_item) != 0)
                    {
                        /* Codes_SRS_UWS_CLIENT_01_058: [ If xio_send fails, uws_client_send_frame_async shall fail and return a non-zero value. ]*/
                        LogError("Could not send bytes through the underlying IO");

                        /* Codes_SRS_UWS_CLIENT_09_001: [ If xio_send fails and the message is still queued, it shall be de-queued and destroyed. ] */
                        if (singlylinkedlist_find(uws_client->pending_sends, find_list_node, new_pending_send_list_item) != NULL)
                        {
                            // Guards against double free in case the underlying I/O invoked 'on_underlying_io_send_complete' within xio_send.
                            (void)singlylinkedlist_remove(uws_client->pending_sends, new_pending_send_list_item);
                            free(ws_pending_send);
                        }

                        result = MU_FAILURE;
                    }
                    else
                    {
                        /* Codes_SRS_UWS_CLIENT_01_042: [ On success, uws_client_send_frame_async shall return 0. ]*/
                        result = 0;
                    }
                }

                BUFFER_delete(non_control_frame_buffer);
            }
        }
    }

    return result;
}